

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

bool __thiscall
QGraphicsViewPrivate::canStartScrollingAt(QGraphicsViewPrivate *this,QPoint *startPos)

{
  bool bVar1;
  DragMode DVar2;
  Int IVar3;
  QPoint *pos;
  QAbstractScrollAreaPrivate *this_00;
  QGraphicsView *in_RSI;
  QGraphicsViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QGraphicsItem *childItem;
  QGraphicsView *q;
  GraphicsItemFlag in_stack_ffffffffffffffbc;
  GraphicsItemFlag other;
  bool local_11;
  QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pos = (QPoint *)q_func(in_RDI);
  DVar2 = QGraphicsView::dragMode((QGraphicsView *)in_RDI);
  if (DVar2 == NoDrag) {
    this_00 = (QAbstractScrollAreaPrivate *)QGraphicsView::itemAt(in_RSI,pos);
    bVar1 = QPoint::isNull(pos);
    other = 0;
    if ((!bVar1) &&
       (other = in_stack_ffffffffffffffbc & 0xffffff, this_00 != (QAbstractScrollAreaPrivate *)0x0))
    {
      QGraphicsItem::flags((QGraphicsItem *)in_RDI);
      local_c.super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i =
           (QFlagsStorage<QGraphicsItem::GraphicsItemFlag>)
           QFlags<QGraphicsItem::GraphicsItemFlag>::operator&
                     ((QFlags<QGraphicsItem::GraphicsItemFlag> *)in_RDI,other);
      IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_c);
      other = (uint)(IVar3 != 0) << 0x18;
    }
    if ((char)(other >> 0x18) == '\0') {
      local_11 = QAbstractScrollAreaPrivate::canStartScrollingAt(this_00,(QPoint *)in_RDI);
    }
    else {
      local_11 = false;
    }
  }
  else {
    local_11 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_11;
  }
  __stack_chk_fail();
}

Assistant:

bool QGraphicsViewPrivate::canStartScrollingAt(const QPoint &startPos) const
{
    Q_Q(const QGraphicsView);
    if (q->dragMode() != QGraphicsView::NoDrag)
        return false;

    const QGraphicsItem *childItem = q->itemAt(startPos);

    if (!startPos.isNull() && childItem && (childItem->flags() & QGraphicsItem::ItemIsMovable))
        return false;

    return QAbstractScrollAreaPrivate::canStartScrollingAt(startPos);
}